

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O2

GCfunc * func_newL(lua_State *L,GCproto *pt,GCtab *env)

{
  GCfunc *pGVar1;
  
  pGVar1 = (GCfunc *)lj_mem_newgco(L,(ulong)pt->sizeuv * 8 + 0x28);
  *(uint8_t *)((long)pGVar1 + 9) = '\b';
  *(uint8_t *)((long)pGVar1 + 10) = '\0';
  (pGVar1->c).nupvalues = '\0';
  (pGVar1->c).pc.ptr64 = (uint64_t)(pt + 1);
  (pGVar1->c).env.gcptr64 = (uint64_t)env;
  pt->flags = (pt->flags - ((byte)(pt->flags + 0x20 >> 3) & 0xe0)) + ' ';
  return pGVar1;
}

Assistant:

static GCfunc *func_newL(lua_State *L, GCproto *pt, GCtab *env)
{
  uint32_t count;
  GCfunc *fn = (GCfunc *)lj_mem_newgco(L, sizeLfunc((MSize)pt->sizeuv));
  fn->l.gct = ~LJ_TFUNC;
  fn->l.ffid = FF_LUA;
  fn->l.nupvalues = 0;  /* Set to zero until upvalues are initialized. */
  /* NOBARRIER: Really a setgcref. But the GCfunc is new (marked white). */
  setmref(fn->l.pc, proto_bc(pt));
  setgcref(fn->l.env, obj2gco(env));
  /* Saturating 3 bit counter (0..7) for created closures. */
  count = (uint32_t)pt->flags + PROTO_CLCOUNT;
  pt->flags = (uint8_t)(count - ((count >> PROTO_CLC_BITS) & PROTO_CLCOUNT));
  return fn;
}